

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

void glu::anon_unknown_4::setVertexAttribPointer(Functions *gl,VertexAttributeDescriptor *va)

{
  bool bVar1;
  deUint32 dVar2;
  deUint32 compTypeGL;
  bool isSpecialType;
  bool isIntType;
  VertexAttributeDescriptor *va_local;
  Functions *gl_local;
  
  bVar1 = de::inRange<int>(va->componentType,0,5);
  de::inRange<int>(va->componentType,6,8);
  dVar2 = getVtxCompGLType(va->componentType);
  (*gl->enableVertexAttribArray)(va->location);
  if ((bVar1) && (va->convert == VTX_COMP_CONVERT_NONE)) {
    (*gl->vertexAttribIPointer)(va->location,va->numComponents,dVar2,va->stride,va->pointer);
  }
  else {
    (*gl->vertexAttribPointer)
              (va->location,va->numComponents,dVar2,
               va->convert == VTX_COMP_CONVERT_NORMALIZE_TO_FLOAT,va->stride,va->pointer);
  }
  return;
}

Assistant:

static void setVertexAttribPointer (const glw::Functions& gl, const VertexAttributeDescriptor& va)
{
	const bool		isIntType		= de::inRange<int>(va.componentType, VTX_COMP_UNSIGNED_INT8, VTX_COMP_SIGNED_INT32);
	const bool		isSpecialType	= de::inRange<int>(va.componentType, VTX_COMP_FIXED, VTX_COMP_FLOAT);
	const deUint32	compTypeGL		= getVtxCompGLType(va.componentType);

	DE_ASSERT(isIntType != isSpecialType); // Must be either int or special type.
	DE_ASSERT(isIntType || va.convert == VTX_COMP_CONVERT_NONE); // Conversion allowed only for special types.
	DE_UNREF(isSpecialType);

	gl.enableVertexAttribArray(va.location);

	if (isIntType && va.convert == VTX_COMP_CONVERT_NONE)
		gl.vertexAttribIPointer(va.location, va.numComponents, compTypeGL, va.stride, va.pointer);
	else
		gl.vertexAttribPointer(va.location, va.numComponents, compTypeGL, va.convert == VTX_COMP_CONVERT_NORMALIZE_TO_FLOAT ? GL_TRUE : GL_FALSE, va.stride, va.pointer);
}